

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ostream *poVar6;
  long lVar7;
  pointer ppVar8;
  undefined8 *puVar9;
  string *psVar10;
  char *__s;
  pointer str;
  byte bVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tagres;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string result;
  char DemoTokens [4] [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  LookupTagres;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> jiebawords;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  keywordres;
  Jieba jieba;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8 [4];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_760;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> local_748;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  local_728;
  undefined1 local_708 [1016];
  FullSegment local_310;
  QuerySegment local_2c0;
  KeywordExtractor local_190;
  
  bVar11 = 0;
  paVar2 = &local_7e8[0].field_2;
  local_7e8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"../dict/jieba.dict.utf8","");
  paVar1 = &local_848.field_2;
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"../dict/hmm_model.utf8","");
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"../dict/user.dict.utf8","");
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"../dict/idf.utf8","");
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"../dict/stop_words.utf8","")
  ;
  cppjieba::Jieba::Jieba((Jieba *)local_708,local_7e8,&local_848,&local_808,&local_868,&local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,
                    CONCAT71(local_808.field_2._M_allocated_capacity._1_7_,
                             local_808.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != paVar1) {
    operator_delete(local_848._M_dataplus._M_p,
                    CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,
                             local_848.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  local_828.field_2._M_allocated_capacity = 0;
  local_828._M_dataplus._M_p = (pointer)0x0;
  local_828._M_string_length = 0;
  local_748.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_748.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_748.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_848._M_string_length = 0;
  local_848.field_2._M_local_buf[0] = '\0';
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  local_808._M_string_length = 0;
  local_808.field_2._M_local_buf[0] = '\0';
  psVar10 = (string *)0x1e;
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_848,0,(char *)0x0,0x11d0bf);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] Cut With HMM",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  cppjieba::MixSegment::Cut
            ((MixSegment *)(local_708 + 0x310),&local_848,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828,true);
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] Cut Without HMM ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  cppjieba::MixSegment::Cut
            ((MixSegment *)(local_708 + 0x310),&local_848,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828,false);
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  psVar10 = (string *)0x1b;
  std::__cxx11::string::_M_replace((ulong)&local_848,0,(char *)local_848._M_string_length,0x11d10c);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[demo] CutAll",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  cppjieba::FullSegment::Cut
            (&local_310,&local_848,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828);
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  psVar10 = (string *)0x4e;
  std::__cxx11::string::_M_replace((ulong)&local_848,0,(char *)local_848._M_string_length,0x11d136);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] CutForSearch",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  cppjieba::QuerySegment::Cut
            (&local_2c0,&local_848,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828,true);
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] Insert User Word",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_7e8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,anon_var_dwarf_205c3,anon_var_dwarf_205c3 + 0xc);
  cppjieba::MixSegment::Cut
            ((MixSegment *)(local_708 + 0x310),local_7e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  local_7e8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,anon_var_dwarf_205c3,anon_var_dwarf_205c3 + 0xc);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"");
  cppjieba::DictTrie::InsertUserWord((DictTrie *)local_708,local_7e8,&local_868);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  local_7e8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,anon_var_dwarf_205c3,anon_var_dwarf_205c3 + 0xc);
  cppjieba::MixSegment::Cut
            ((MixSegment *)(local_708 + 0x310),local_7e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_828,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  sVar5 = local_828._M_string_length;
  _Var4._M_p = local_828._M_dataplus._M_p;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"/","");
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_7e8,(limonp *)_Var4._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar5,&local_868,psVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_7e8[0]._M_dataplus._M_p,
                      local_7e8[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_7e8[0]._M_dataplus._M_p,local_7e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] CutForSearch Word With Offset",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  cppjieba::QuerySegment::Cut(&local_2c0,&local_848,&local_748,true);
  poVar6 = std::operator<<((ostream *)&std::cout,&local_748);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] Lookup Tag for Single Token",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  puVar9 = &DAT_0011e5f0;
  psVar10 = local_7e8;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar10->_M_dataplus)._M_p = (pointer)*puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    psVar10 = (string *)((long)psVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_760,4,(allocator_type *)&local_868);
  if (local_760.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_760.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar8 = local_760.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    str = local_760.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s = (char *)((long)&local_7e8[0]._M_dataplus._M_p +
                    ((long)ppVar8 -
                     (long)local_760.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 1));
      pcVar3 = (char *)(str->first)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)str,0,pcVar3,(ulong)__s);
      cppjieba::PosTagger::LookupTag
                (&local_868,(PosTagger *)(local_708 + 0x3f0),&str->first,
                 (SegmentTagged *)(local_708 + 0x310));
      std::__cxx11::string::operator=((string *)&str->second,(string *)&local_868);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
      }
      str = str + 1;
      ppVar8 = ppVar8 + 1;
    } while (str != local_760.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,&local_760);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[demo] Tagging",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_868._M_dataplus._M_p = (pointer)0x0;
  local_868._M_string_length = 0;
  local_868.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::_M_replace((ulong)&local_848,0,(char *)local_848._M_string_length,0x11d215);
  cppjieba::PosTagger::Tag
            ((PosTagger *)(local_708 + 0x3f0),&local_848,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_868,(SegmentTagged *)(local_708 + 0x310));
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  poVar6 = std::operator<<((ostream *)&std::cout,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_868);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[demo] Keyword Extraction",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_728.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_728.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_728.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cppjieba::KeywordExtractor::Extract(&local_190,&local_848,&local_728,5);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_848._M_dataplus._M_p,local_848._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  poVar6 = std::operator<<((ostream *)&std::cout,&local_728);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector(&local_728);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_868);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_760);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,
                    CONCAT71(local_808.field_2._M_allocated_capacity._1_7_,
                             local_808.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,
                    CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,
                             local_848.field_2._M_local_buf[0]) + 1);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&local_748);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_828);
  cppjieba::Jieba::~Jieba((Jieba *)local_708);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  cppjieba::Jieba jieba(DICT_PATH,
        HMM_PATH,
        USER_DICT_PATH,
        IDF_PATH,
        STOP_WORD_PATH);
  vector<string> words;
  vector<cppjieba::Word> jiebawords;
  string s;
  string result;

  s = "他来到了网易杭研大厦";
  cout << s << endl;
  cout << "[demo] Cut With HMM" << endl;
  jieba.Cut(s, words, true);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Cut Without HMM " << endl;
  jieba.Cut(s, words, false);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "我来到北京清华大学";
  cout << s << endl;
  cout << "[demo] CutAll" << endl;
  jieba.CutAll(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "小明硕士毕业于中国科学院计算所，后在日本京都大学深造";
  cout << s << endl;
  cout << "[demo] CutForSearch" << endl;
  jieba.CutForSearch(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Insert User Word" << endl;
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;
  jieba.InsertUserWord("男默女泪");
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] CutForSearch Word With Offset" << endl;
  jieba.CutForSearch(s, jiebawords, true);
  cout << jiebawords << endl;

  cout << "[demo] Lookup Tag for Single Token" << endl;
  const int DemoTokenMaxLen = 32;
  char DemoTokens[][DemoTokenMaxLen] = {"拖拉机", "CEO", "123", "。"};
  vector<pair<string, string> > LookupTagres(sizeof(DemoTokens) / DemoTokenMaxLen);
  vector<pair<string, string> >::iterator it;
  for (it = LookupTagres.begin(); it != LookupTagres.end(); it++) {
	it->first = DemoTokens[it - LookupTagres.begin()];
	it->second = jieba.LookupTag(it->first);
  }
  cout << LookupTagres << endl;

  cout << "[demo] Tagging" << endl;
  vector<pair<string, string> > tagres;
  s = "我是拖拉机学院手扶拖拉机专业的。不用多久，我就会升职加薪，当上CEO，走上人生巅峰。";
  jieba.Tag(s, tagres);
  cout << s << endl;
  cout << tagres << endl;

  cout << "[demo] Keyword Extraction" << endl;
  const size_t topk = 5;
  vector<cppjieba::KeywordExtractor::Word> keywordres;
  jieba.extractor.Extract(s, keywordres, topk);
  cout << s << endl;
  cout << keywordres << endl;
  return EXIT_SUCCESS;
}